

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool CreatePidFile(ArgsManager *args)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  ofstream file;
  undefined4 in_stack_fffffffffffffca8;
  openmode in_stack_fffffffffffffcac;
  undefined5 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb5;
  undefined1 in_stack_fffffffffffffcb6;
  undefined1 in_stack_fffffffffffffcb7;
  basic_ofstream<char,_std::char_traits<char>_> *this;
  int *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  bilingual_str *in_stack_fffffffffffffcd0;
  bool local_31d;
  ArgsManager *in_stack_fffffffffffffce8;
  ConstevalStringLiteral in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  bilingual_str *in_stack_fffffffffffffd28;
  basic_ofstream<char,_std::char_traits<char>_> local_230 [40];
  long local_208 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_230;
  GetPidFile(in_stack_fffffffffffffce8);
  std::ofstream::ofstream<fs::path,fs::path>
            (this,(path *)CONCAT17(in_stack_fffffffffffffcb7,
                                   CONCAT16(in_stack_fffffffffffffcb6,
                                            CONCAT15(in_stack_fffffffffffffcb5,
                                                     in_stack_fffffffffffffcb0))),
             in_stack_fffffffffffffcac);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  uVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_208 + *(long *)(local_208[0] + -0x18)));
  if ((bool)uVar1) {
    getpid();
    tinyformat::format<int>
              ((ostream *)in_stack_fffffffffffffcd0,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               in_stack_fffffffffffffcc0);
    g_generated_pid = true;
    local_31d = true;
  }
  else {
    _(in_stack_fffffffffffffcf8);
    GetPidFile(in_stack_fffffffffffffce8);
    fs::PathToString_abi_cxx11_
              ((path *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffcb6,
                                               CONCAT15(in_stack_fffffffffffffcb5,
                                                        in_stack_fffffffffffffcb0))));
    __errno_location();
    SysErrorString_abi_cxx11_(in_stack_fffffffffffffccc);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_31d = InitError(in_stack_fffffffffffffcd0);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  std::ofstream::~ofstream(local_208);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31d;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static bool CreatePidFile(const ArgsManager& args)
{
    std::ofstream file{GetPidFile(args)};
    if (file) {
#ifdef WIN32
        tfm::format(file, "%d\n", GetCurrentProcessId());
#else
        tfm::format(file, "%d\n", getpid());
#endif
        g_generated_pid = true;
        return true;
    } else {
        return InitError(strprintf(_("Unable to create the PID file '%s': %s"), fs::PathToString(GetPidFile(args)), SysErrorString(errno)));
    }
}